

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_packet_decoder.c
# Opt level: O0

int pkt_to_user(pt_packet *upkt,size_t size,pt_packet *pkt)

{
  pt_packet *pkt_local;
  size_t size_local;
  pt_packet *upkt_local;
  
  if ((upkt == (pt_packet *)0x0) || (pkt == (pt_packet *)0x0)) {
    upkt_local._4_4_ = -1;
  }
  else if (upkt == pkt) {
    upkt_local._4_4_ = 0;
  }
  else {
    pkt_local = (pt_packet *)size;
    if (0x18 < size) {
      memset(upkt + 1,0,size - 0x18);
      pkt_local = (pt_packet *)0x18;
    }
    memcpy(upkt,pkt,(size_t)pkt_local);
    upkt_local._4_4_ = 0;
  }
  return upkt_local._4_4_;
}

Assistant:

static inline int pkt_to_user(struct pt_packet *upkt, size_t size,
			      const struct pt_packet *pkt)
{
	if (!upkt || !pkt)
		return -pte_internal;

	if (upkt == pkt)
		return 0;

	/* Zero out any unknown bytes. */
	if (sizeof(*pkt) < size) {
		memset(((uint8_t *) upkt) + sizeof(*pkt), 0,
		       size - sizeof(*pkt));

		size = sizeof(*pkt);
	}

	memcpy(upkt, pkt, size);

	return 0;
}